

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

void cleanup_curse(void)

{
  object *obj;
  ulong uVar1;
  long lVar2;
  
  if (z_info->curse_max != '\0') {
    lVar2 = 0;
    uVar1 = 0;
    do {
      string_free(*(char **)(curses->conflict_flags + lVar2 + -0x20));
      string_free(*(char **)(curses->conflict_flags + lVar2 + -8));
      mem_free(*(void **)(curses->conflict_flags + lVar2 + 8));
      if (*(long *)(curses->conflict_flags + lVar2 + -0x10) != 0) {
        free_effect(*(effect **)(*(long *)(curses->conflict_flags + lVar2 + -0x10) + 0xf0));
        mem_free(*(void **)(*(long *)(curses->conflict_flags + lVar2 + -0x10) + 0xf8));
        obj = *(object **)(*(long *)(curses->conflict_flags + lVar2 + -0x10) + 0x28);
        if (obj != (object *)0x0) {
          object_free(obj);
        }
        mem_free(*(void **)(curses->conflict_flags + lVar2 + -0x10));
      }
      mem_free(*(void **)(curses->conflict_flags + lVar2 + -0x18));
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x38;
    } while (uVar1 < z_info->curse_max);
  }
  mem_free(curses);
  return;
}

Assistant:

static void cleanup_curse(void)
{
	int idx;
	for (idx = 0; idx < z_info->curse_max; idx++) {
		string_free(curses[idx].name);
		string_free(curses[idx].conflict);
		mem_free(curses[idx].desc);
		if (curses[idx].obj) {
			free_effect(curses[idx].obj->effect);
			mem_free(curses[idx].obj->effect_msg);
			if (curses[idx].obj->known) {
				object_free(curses[idx].obj->known);
			}
			mem_free(curses[idx].obj);
		}
		mem_free(curses[idx].poss);
	}
	mem_free(curses);
}